

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O3

bool __thiscall AMovingCamera::Interpolate(AMovingCamera *this)

{
  double dVar1;
  double dVar2;
  AActor *pAVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  pAVar3 = (this->super_APathFollower).super_AActor.tracer.field_0.p;
  if (pAVar3 != (AActor *)0x0) {
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      bVar4 = APathFollower::Interpolate(&this->super_APathFollower);
      if (bVar4) {
        pAVar3 = (this->super_APathFollower).super_AActor.tracer.field_0.p;
        dVar5 = c_atan2((pAVar3->__Pos).Y - (this->super_APathFollower).super_AActor.__Pos.Y,
                        (pAVar3->__Pos).X - (this->super_APathFollower).super_AActor.__Pos.X);
        (this->super_APathFollower).super_AActor.Angles.Yaw.Degrees = dVar5 * 57.29577951308232;
        bVar4 = true;
        if (((this->super_APathFollower).super_AActor.args[2] & 4) != 0) {
          dVar5 = (this->super_APathFollower).super_AActor.__Pos.Z;
          pAVar3 = (this->super_APathFollower).super_AActor.tracer.field_0.p;
          dVar1 = pAVar3->Height;
          dVar2 = (pAVar3->__Pos).Z;
          dVar6 = (this->super_APathFollower).super_AActor.__Pos.X - (pAVar3->__Pos).X;
          dVar7 = (this->super_APathFollower).super_AActor.__Pos.Y - (pAVar3->__Pos).Y;
          dVar6 = c_sqrt(dVar7 * dVar7 + dVar6 * dVar6);
          dVar7 = 0.0;
          if ((dVar6 != 0.0) || (NAN(dVar6))) {
            dVar7 = c_atan2(dVar5 - (dVar1 * 0.5 + dVar2),dVar6);
            dVar7 = dVar7 * 57.29577951308232;
          }
          (this->super_APathFollower).super_AActor.Angles.Pitch.Degrees = dVar7;
        }
      }
      else {
        bVar4 = false;
      }
      return bVar4;
    }
    (this->super_APathFollower).super_AActor.tracer.field_0.p = (AActor *)0x0;
  }
  bVar4 = APathFollower::Interpolate(&this->super_APathFollower);
  return bVar4;
}

Assistant:

bool AMovingCamera::Interpolate ()
{
	if (tracer == NULL)
		return Super::Interpolate ();

	if (Super::Interpolate ())
	{
		Angles.Yaw = AngleTo(tracer, true);

		if (args[2] & 4)
		{ // Also aim camera's pitch;
			DVector3 diff = Pos() - tracer->PosPlusZ(tracer->Height / 2);
			double dist = diff.XY().Length();
			Angles.Pitch = dist != 0.f ? VecToAngle(dist, diff.Z) : 0.;
		}

		return true;
	}
	return false;
}